

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.cpp
# Opt level: O2

void * LIRMIA3Thread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  double urt;
  double ult;
  double uft;
  double uat;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  int local_87c;
  CHRONO chrono_period;
  char szTemp [256];
  LIRMIA3 lirmia3;
  char szSaveFilePath [256];
  
  memset(&lirmia3,0,0x5d0);
  StartChrono(&chrono_period);
  lVar9 = 0x32;
  bVar3 = true;
  local_87c = 0;
LAB_00188fca:
  do {
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      uSleep((long)((int)lVar9 * 1000));
      if (bPauseLIRMIA3 == 0) break;
      if (!bVar3) {
        puts("LIRMIA3 paused.");
        DisconnectLIRMIA3(&lirmia3);
      }
      if (bExit != 0) {
LAB_001892ac:
        bVar2 = true;
        goto LAB_001892ae;
      }
      mSleep(100);
      bVar3 = true;
    }
    if (bRestartLIRMIA3 == 0) {
      if (bVar3) goto LAB_00189063;
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      uat = u4;
      uft = u3;
      ult = u2;
      urt = u1;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      iVar5 = SetThrustersLIRMIA3(&lirmia3,urt,ult,uft,uat);
      if (iVar5 == 0) goto LAB_0018928b;
      puts("Connection to a LIRMIA3 lost.");
      DisconnectLIRMIA3(&lirmia3);
    }
    else {
      if (!bVar3) {
        puts("Restarting a LIRMIA3.");
        DisconnectLIRMIA3(&lirmia3);
      }
      bRestartLIRMIA3 = 0;
LAB_00189063:
      iVar5 = ConnectLIRMIA3(&lirmia3,"LIRMIA3.txt");
      if (iVar5 == 0) break;
      mSleep(1000);
    }
    local_87c = local_87c + 1;
    if (ExitOnErrorCount <= local_87c && 0 < ExitOnErrorCount) {
      bExit = 1;
      goto LAB_001892ac;
    }
    bVar3 = true;
    bVar2 = true;
    if (bExit != 0) goto LAB_001892ae;
  } while( true );
  lVar9 = (long)lirmia3.threadperiod;
  uSleep(lVar9 * 1000);
  if (lirmia3.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)lirmia3.pfSaveFile);
    lirmia3.pfSaveFile = (FILE *)0x0;
  }
  if (lirmia3.bSaveRawData != 0) {
    if (lirmia3.szCfgFilePath[0] == '\0') {
      builtin_strncpy(szTemp,"lirmia3",8);
    }
    else {
      sprintf(szTemp,"%.127s",lirmia3.szCfgFilePath);
    }
    sVar6 = strlen(szTemp);
    iVar5 = (int)sVar6 + 1;
    uVar8 = sVar6 & 0xffffffff;
    do {
      if ((int)uVar8 < 1) goto LAB_00189221;
      uVar1 = uVar8 - 1;
      iVar5 = iVar5 + -1;
      lVar4 = uVar8 - 1;
      uVar8 = uVar1;
    } while (szTemp[lVar4] != '.');
    if ((uVar1 != 0) && (iVar5 <= (int)sVar6)) {
      memset(szTemp + (uVar1 & 0xffffffff),0,sVar6 - (uVar1 & 0xffffffff));
    }
LAB_00189221:
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar7 = strtimeex_fns();
    sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar7);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    lirmia3.pfSaveFile = (FILE *)fopen(szSaveFilePath,"wb");
    if ((FILE *)lirmia3.pfSaveFile == (FILE *)0x0) {
      puts("Unable to create LIRMIA3 data file.");
      goto LAB_00189316;
    }
  }
LAB_0018928b:
  bVar3 = false;
  if (bExit != 0) {
LAB_00189316:
    SetThrustersLIRMIA3(&lirmia3,0.0,0.0,0.0,0.0);
    mSleep(0x32);
    bVar2 = false;
LAB_001892ae:
    StopChronoQuick(&chrono_period);
    if (lirmia3.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)lirmia3.pfSaveFile);
      lirmia3.pfSaveFile = (FILE *)0x0;
    }
    if (!bVar2) {
      DisconnectLIRMIA3(&lirmia3);
    }
    if (bExit == 0) {
      bExit = 1;
    }
    return (void *)0x0;
  }
  goto LAB_00188fca;
}

Assistant:

THREAD_PROC_RETURN_VALUE LIRMIA3Thread(void* pParam)
{
	LIRMIA3 lirmia3;
	double thrust1 = 0, thrust2 = 0, thrust3 = 0, thrust4 = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&lirmia3, 0, sizeof(LIRMIA3));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		uSleep(1000*threadperiod);

		if (bPauseLIRMIA3) 
		{
			if (bConnected)
			{
				printf("LIRMIA3 paused.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartLIRMIA3) 
		{
			if (bConnected)
			{
				printf("Restarting a LIRMIA3.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
			bRestartLIRMIA3 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectLIRMIA3(&lirmia3, "LIRMIA3.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = lirmia3.threadperiod;
				uSleep(1000*threadperiod);

				if (lirmia3.pfSaveFile != NULL)
				{
					fclose(lirmia3.pfSaveFile); 
					lirmia3.pfSaveFile = NULL;
				}
				if ((lirmia3.bSaveRawData)&&(lirmia3.pfSaveFile == NULL)) 
				{
					if (strlen(lirmia3.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", lirmia3.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "lirmia3");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					lirmia3.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (lirmia3.pfSaveFile == NULL) 
					{
						printf("Unable to create LIRMIA3 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			EnterCriticalSection(&StateVariablesCS);
			thrust1 = u1;
			thrust2 = u2;
			thrust3 = u3;
			thrust4 = u4;
			LeaveCriticalSection(&StateVariablesCS);
			if (SetThrustersLIRMIA3(&lirmia3, thrust1, thrust2, thrust3, thrust4) != EXIT_SUCCESS)
			{
				printf("Connection to a LIRMIA3 lost.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
		}

		//printf("LIRMIA3Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	// Ensure the thrusters are stopped...
	if (bConnected)
	{
		SetThrustersLIRMIA3(&lirmia3, 0, 0, 0, 0);
		mSleep(50);
	}

	StopChronoQuick(&chrono_period);

	if (lirmia3.pfSaveFile != NULL)
	{
		fclose(lirmia3.pfSaveFile); 
		lirmia3.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectLIRMIA3(&lirmia3);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}